

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result * __thiscall
testing::
Action<ot::commissioner::Error(std::function<void(ot::commissioner::BorderAgent_const*,ot::commissioner::Error_const&)>,unsigned_long,std::__cxx11::string_const&)>
::ActionAdapter::operator()
          (Result *__return_storage_ptr__,void *this,
          function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
          *args,unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  long *plVar1;
  tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>_&&,_unsigned_long_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_30;
  
  plVar1 = *this;
  local_30.
  super__Tuple_impl<0UL,_std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>_&&,_unsigned_long_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<1UL,_unsigned_long_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       (_Head_base<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        )(_Head_base<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
          )args_2;
  local_30.
  super__Tuple_impl<0UL,_std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>_&&,_unsigned_long_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<1UL,_unsigned_long_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<1UL,_unsigned_long_&&,_false>._M_head_impl = args_1;
  local_30.
  super__Tuple_impl<0UL,_std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>_&&,_unsigned_long_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<0UL,_std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>_&&,_false>
  ._M_head_impl = args;
  std::
  tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::
  tuple<std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>_&&,_unsigned_long_&&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
            (&local_60,&local_30);
  (**(code **)(*plVar1 + 0x10))(__return_storage_ptr__,plVar1,&local_60);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &local_60.
              super__Tuple_impl<0UL,_std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              .
              super__Head_base<0UL,_std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>,_false>
            );
  return __return_storage_ptr__;
}

Assistant:

typename internal::Function<F>::Result operator()(Args&&... args) {
      return impl_->Perform(
          ::std::forward_as_tuple(::std::forward<Args>(args)...));
    }